

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O1

void __thiscall cppjit::builder::builder::read_and_print_log(builder *this,string *path)

{
  char cVar1;
  istream *piVar2;
  ostream *poVar3;
  string line;
  ifstream f;
  char *local_250;
  long local_248;
  char local_240;
  undefined7 uStack_23f;
  long local_230 [65];
  
  std::ifstream::ifstream((string *)local_230);
  std::ifstream::open((string *)local_230,(_Ios_Openmode)path);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"could not read log file",0x17);
  }
  else {
    local_248 = 0;
    local_240 = '\0';
    local_250 = &local_240;
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) +
                              (char)(string *)local_230);
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_230,(string *)&local_250,cVar1);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_250,local_248);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    std::ifstream::close();
    if (local_250 != &local_240) {
      operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
    }
  }
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

void read_and_print_log(std::string path) {
    std::ifstream f;
    f.open(path);
    if (!f.is_open()) {
      std::cerr << "could not read log file";
      return;
    }
    std::string line;
    while (std::getline(f, line)) {
      std::cerr << line << std::endl;
    }
    f.close();
  }